

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int local_3c;
  int local_38;
  int n_p;
  int n_d;
  Helper h;
  
  local_3c = 0;
  local_38 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nPlease input program size: ",0x1c);
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nPlease input data size: ",0x19);
  std::istream::operator>>((istream *)&std::cin,&local_38);
  if (local_38 < 1 || local_3c < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid input! Terminating...",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  else {
    Helper::Helper((Helper *)&n_p,local_3c,local_38,1000);
    Helper::Init((Helper *)&n_p);
    Helper::~Helper((Helper *)&n_p);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int n_p = 0;
    int n_d = 0;
    cout<<"\nPlease input program size: ";
    cin>> n_p;
    cout<<"\nPlease input data size: ";
    cin>> n_d;
    if(n_p > 0 && n_d > 0)
    {
        Helper h(n_p, n_d, 1000);
	    h.Init();
    }
    else
        cout<<"\nInvalid input! Terminating..."<<endl;
        
	return 0; 
}